

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Erat.cpp
# Opt level: O0

void __thiscall primesieve::Erat::preSieve(Erat *this)

{
  byte bVar1;
  uint64_t pos;
  byte *pbVar2;
  ulong *in_RDI;
  uint64_t rem;
  uint64_t in_stack_00000198;
  Vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_000001a0;
  
  PreSieve::preSieve(in_stack_000001a0,in_stack_00000198);
  if (in_RDI[2] <= *in_RDI) {
    pos = byteRemainder(*in_RDI);
    pbVar2 = Array<unsigned_char,_37UL>::operator[]
                       ((Array<unsigned_char,_37UL> *)(anonymous_namespace)::unsetSmaller,pos);
    bVar1 = *pbVar2;
    pbVar2 = Vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((Vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 4),0);
    *pbVar2 = *pbVar2 & bVar1;
  }
  return;
}

Assistant:

void Erat::preSieve()
{
  PreSieve::preSieve(sieve_, segmentLow_);

  // unset bits < start
  if (segmentLow_ <= start_)
  {
    uint64_t rem = byteRemainder(start_);
    sieve_[0] &= unsetSmaller[rem];
  }
}